

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

_Bool upb_Array_Resize(upb_Array *arr,size_t size,upb_Arena *arena)

{
  ulong uVar1;
  ulong uVar2;
  _Bool _Var3;
  sbyte sVar4;
  
  if ((arr->data_dont_copy_me__upb_internal_use_only & 4) != 0) {
    __assert_fail("!upb_Array_IsFrozen(arr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                  ,0x68,"_Bool upb_Array_Resize(upb_Array *, size_t, upb_Arena *)");
  }
  uVar1 = arr->size_dont_copy_me__upb_internal_use_only;
  if (arena != (upb_Arena *)0x0 || size <= uVar1) {
    _Var3 = true;
    if (arr->capacity_dont_copy_me__upb_internal_use_only < size) {
      _Var3 = _upb_Array_Realloc_dont_copy_me__upb_internal_use_only(arr,size,arena);
    }
    if (_Var3 != false) {
      arr->size_dont_copy_me__upb_internal_use_only = size;
      if (uVar1 <= size && size - uVar1 != 0) {
        uVar2 = arr->data_dont_copy_me__upb_internal_use_only;
        sVar4 = ((uVar2 & 3) != 0) + ((byte)uVar2 & 3);
        memset((void *)((uVar1 << sVar4) + (uVar2 & 0xfffffffffffffff8)),0,size - uVar1 << sVar4);
      }
    }
    return _Var3;
  }
  __assert_fail("size <= array->size_dont_copy_me__upb_internal_use_only || arena",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/array.h"
                ,0x6e,
                "_Bool _upb_Array_ResizeUninitialized_dont_copy_me__upb_internal_use_only(struct upb_Array *, size_t, upb_Arena *)"
               );
}

Assistant:

bool upb_Array_Resize(upb_Array* arr, size_t size, upb_Arena* arena) {
  UPB_ASSERT(!upb_Array_IsFrozen(arr));
  const size_t oldsize = arr->UPB_PRIVATE(size);
  if (UPB_UNLIKELY(
          !UPB_PRIVATE(_upb_Array_ResizeUninitialized)(arr, size, arena))) {
    return false;
  }
  const size_t newsize = arr->UPB_PRIVATE(size);
  if (newsize > oldsize) {
    const int lg2 = UPB_PRIVATE(_upb_Array_ElemSizeLg2)(arr);
    char* data = upb_Array_MutableDataPtr(arr);
    memset(data + (oldsize << lg2), 0, (newsize - oldsize) << lg2);
  }
  return true;
}